

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
std::
_Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
::_Tuple_impl(_Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
              *this)

{
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Tuple_impl<3UL,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<3UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::func::Type>.impl_.value_ = (MatcherInterface<mp::func::Type> *)0x0;
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Tuple_impl<3UL,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<3UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::func::Type>.impl_.link_.next_ =
       &(this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
        super__Tuple_impl<3UL,_testing::Matcher<mp::func::Type>_>.
        super__Head_base<3UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
        super_MatcherBase<mp::func::Type>.impl_.link_;
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Tuple_impl<3UL,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<3UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::func::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0025e998;
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = &(this->
                 super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
                 super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.
                 super_MatcherBase<int>.impl_.link_;
  (this->super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>).
  super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0025d418;
  (this->super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>)._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>.impl_.value_ =
       (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  (this->super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>)._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>.impl_.link_.next_ =
       &(this->super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>).
        _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_>.impl_.link_;
  (this->super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>)._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0025ea00;
  return;
}

Assistant:

void capture(T* ptr) {
    value_ = ptr;
    link_.join_new();
  }